

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall FBehavior::SerializeVars(FBehavior *this,FSerializer *arc)

{
  bool bVar1;
  FBehavior *this_00;
  long lVar2;
  long lVar3;
  
  this_00 = (FBehavior *)arc;
  bVar1 = FSerializer::BeginArray(arc,"variables");
  if (bVar1) {
    SerializeVarSet(this_00,arc,this->MapVarStore,0x80);
    if (0 < this->NumArrays) {
      lVar3 = 8;
      lVar2 = 0;
      do {
        SerializeVarSet(this_00,arc,*(SDWORD **)((long)&this->ArrayStore->ArraySize + lVar3),
                        *(int *)((long)this->ArrayStore + lVar3 + -8));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < this->NumArrays);
    }
    FSerializer::EndArray(arc);
    return;
  }
  return;
}

Assistant:

void FBehavior::SerializeVars (FSerializer &arc)
{
	if (arc.BeginArray("variables"))
	{
		SerializeVarSet(arc, MapVarStore, NUM_MAPVARS);
		for (int i = 0; i < NumArrays; ++i)
		{
			SerializeVarSet(arc, ArrayStore[i].Elements, ArrayStore[i].ArraySize);
		}
		arc.EndArray();
	}
}